

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowlev2.c
# Opt level: O0

LispPTR N_OP_addbase(LispPTR base,LispPTR offset)

{
  LispPTR *pLVar1;
  uint local_10;
  LispPTR offset_local;
  LispPTR base_local;
  
  local_10 = base & 0xfffffff;
  if ((offset & 0xfff0000) == 0xe0000) {
    offset_local = local_10 + (offset & 0xffff);
  }
  else if ((offset & 0xfff0000) == 0xf0000) {
    offset_local = local_10 + (offset | 0xffff0000);
  }
  else if ((*(ushort *)((ulong)(MDStypetbl + (offset >> 9)) ^ 2) & 0x7ff) == 2) {
    pLVar1 = NativeAligned4FromLAddr(offset);
    offset_local = local_10 + *pLVar1;
  }
  else {
    MachineState.errorexit = 1;
    offset_local = 0xffffffff;
    MachineState.tosvalue = offset;
  }
  return offset_local;
}

Assistant:

LispPTR N_OP_addbase(LispPTR base, LispPTR offset) {
  base = POINTERMASK & base;
  switch ((SEGMASK & offset)) {
    case S_POSITIVE: return (base + (offset & 0x0000FFFF));
    case S_NEGATIVE: return (base + (offset | 0xFFFF0000));
    default:
      switch ((GetTypeNumber(offset))) {
        case TYPE_FIXP:
          /* overflow or underflow isn't check */
          return (base + *(int *)NativeAligned4FromLAddr(offset));
        default: /* floatp also */ ERROR_EXIT(offset);
      } /* end switch */
  }     /* end switch */
}